

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O2

int PAL_sscanf(char *buffer,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined1 local_28 [8];
  va_list ap;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (PAL_InitializeChakraCoreCalled) {
    ap[0].overflow_arg_area = local_d8;
    ap[0]._0_8_ = &stack0x00000008;
    local_28._0_4_ = 0x10;
    local_28._4_4_ = 0x30;
    iVar1 = PAL_vsscanf(buffer,format,(__va_list_tag *)local_28);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

__attribute__((no_instrument_function))
int
__cdecl
PAL_sscanf(
           const char *buffer,
           const char *format,
           ...)
{
    int Length;
    va_list ap;

    PERF_ENTRY(sscanf);
    ENTRY("PAL_sscanf (buffer=%p (%s), format=%p (%s))\n", buffer, buffer, format, format);

    va_start(ap, format);
    Length = PAL_vsscanf(buffer, format, ap);
    va_end(ap);

    LOGEXIT("PAL_sscanf returns int %d\n", Length);
    PERF_EXIT(sscanf);
    return Length;
}